

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScParser.cpp
# Opt level: O2

bool __thiscall ScParser::parseFunctionCall(ScParser *this,char **data)

{
  bool bVar1;
  ScName target;
  ScHistoryMode historyMode;
  
  if (this->m_hasCurrentState == true) {
    bVar1 = expectString<49ul>(data,(char (*) [49])
                                    "boost::statechart::detail::safe_reaction_result ");
    if (!bVar1) {
      expectString<44ul>(data,(char (*) [44])"boost::statechart::detail::reaction_result ");
    }
    bVar1 = expectString<33ul>(data,(char (*) [33])"boost::statechart::simple_state<");
    if (bVar1) {
      matchAngleArgument(data,true);
      bVar1 = expectString<11ul>(data,(char (*) [11])"::transit<");
      if (bVar1) {
        matchTransitionTarget((ScTarget *)&target,data);
        ScModel::addTransition(this->m_model,&target,&this->m_currentEvent,historyMode);
        std::__cxx11::string::~string((string *)&target);
      }
      else {
        bVar1 = expectString<18ul>(data,(char (*) [18])"::discard_event()");
        if (!bVar1) {
          bVar1 = expectString<16ul>(data,(char (*) [16])"::defer_event()");
          if (!bVar1) {
            return true;
          }
          ScModel::addDeferral(this->m_model,&this->m_currentEvent);
          return true;
        }
        ScModel::addTransition(this->m_model,&this->m_currentState,&this->m_currentEvent,None);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ScParser::parseFunctionCall(char *&data)
{
    if (!m_hasCurrentState) {
        return false;
    }

    // boost::statechart::detail::safe_reaction_result
    //     boost::statechart::simple_state<...>::transit<*state-name*>()

    if (!expectStartsWith(data, "boost::statechart::detail::safe_reaction_result ")) {
        expectStartsWith(data, "boost::statechart::detail::reaction_result ");
    }
    if (expectStartsWith(data, "boost::statechart::simple_state<")) {
        matchAngleArgument(data, true);
        if (expectStartsWith(data, "::transit<")) {
            auto [target, historyMode] = matchTransitionTarget(data);
            m_model.addTransition(target, m_currentEvent, historyMode);
        } else if (expectStartsWith(data, "::discard_event()")) {
            m_model.addTransition(m_currentState, m_currentEvent);
        } else if (expectStartsWith(data, "::defer_event()")) {
            m_model.addDeferral(m_currentEvent);
        }
        return true;
    }
    return false;
}